

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O1

void R_DeinitTranslationTables(void)

{
  uint uVar1;
  FRemapTable *this;
  ulong uVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    if (translationtables[lVar3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Count != 0) {
      uVar2 = 0;
      do {
        this = translationtables[lVar3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[uVar2].Ptr
        ;
        if (this != (FRemapTable *)0x0) {
          FRemapTable::Free(this);
          operator_delete(this,0x20);
          translationtables[lVar3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[uVar2].Ptr =
               (FRemapTable *)0x0;
        }
        uVar2 = uVar2 + 1;
        uVar1 = translationtables[lVar3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Count;
      } while (uVar2 < uVar1);
      if (uVar1 != 0) {
        translationtables[lVar3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Count = 0;
      }
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0xb);
  if (BloodTranslationColors.Count != 0) {
    BloodTranslationColors.Count = 0;
  }
  return;
}

Assistant:

void R_DeinitTranslationTables()
{
	for (int i = 0; i < NUM_TRANSLATION_TABLES; ++i)
	{
		for (unsigned int j = 0; j < translationtables[i].Size(); ++j)
		{
			if (translationtables[i][j] != NULL)
			{
				delete translationtables[i][j];
				translationtables[i][j] = NULL;
			}
		}
		translationtables[i].Clear();
	}
	BloodTranslationColors.Clear();
}